

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_MAP_AREA(effect_handler_context_t_conflict *context)

{
  short sVar1;
  short sVar2;
  chunk_conflict *pcVar3;
  _Bool _Var4;
  loc_conflict lVar5;
  loc_conflict lVar6;
  source origin;
  wchar_t local_6c;
  wchar_t local_68;
  loc_conflict grid_1;
  wchar_t xx;
  wchar_t yy;
  loc_conflict grid;
  loc_conflict centre;
  wchar_t dist_x;
  wchar_t dist_y;
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  if (context->y == 0) {
    local_68 = (context->value).dice;
  }
  else {
    local_68 = context->y;
  }
  if (context->x == 0) {
    local_6c = (context->value).sides;
  }
  else {
    local_6c = context->x;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  lVar5 = origin_get_loc(origin);
  grid.y = lVar5.y;
  dist_y = grid.y - local_68;
  dist_x = grid.y + local_68;
  grid.x = lVar5.x;
  y1 = grid.x - local_6c;
  y2 = grid.x + local_6c;
  if (dist_y < L'\0') {
    dist_y = L'\0';
  }
  if (y1 < L'\0') {
    y1 = L'\0';
  }
  if (cave->height + L'\xffffffff' < dist_x) {
    dist_x = cave->height + L'\xffffffff';
  }
  if (cave->width + L'\xffffffff' < y2) {
    y2 = cave->width + L'\xffffffff';
  }
  x2 = dist_y;
  do {
    if (dist_x <= x2) {
      for (x2 = dist_y + L'\xffffffff'; x2 < dist_x + L'\x01'; x2 = x2 + L'\x01') {
        for (x1 = y1 + L'\xffffffff'; x1 < y2 + L'\x01'; x1 = x1 + L'\x01') {
          lVar5 = (loc_conflict)loc(x1,x2);
          _Var4 = square_in_bounds((chunk *)cave,lVar5);
          if (_Var4) {
            square_unmark((chunk *)cave,lVar5);
          }
        }
      }
      player->upkeep->update = player->upkeep->update | 0x60;
      player->upkeep->redraw = player->upkeep->redraw | 0xc10000;
      context->ident = true;
      return true;
    }
    for (x1 = y1; x1 < y2; x1 = x1 + L'\x01') {
      lVar5 = (loc_conflict)loc(x1,x2);
      _Var4 = square_isno_map((chunk *)cave,lVar5);
      if (!_Var4) {
        _Var4 = square_seemslikewall((chunk *)cave,lVar5);
        if (!_Var4) {
          _Var4 = square_in_bounds_fully((chunk *)cave,lVar5);
          if (!_Var4) goto LAB_0014f26c;
          _Var4 = square_isfloor((chunk *)cave,lVar5);
          if (!_Var4) {
            square_memorize((chunk *)cave,lVar5);
          }
          for (y = L'\0'; pcVar3 = cave, y < L'\b'; y = y + L'\x01') {
            sVar1 = ddy_ddd[y];
            sVar2 = ddx_ddd[y];
            lVar6 = (loc_conflict)loc(x1 + sVar2,x2 + sVar1);
            _Var4 = square_seemslikewall((chunk *)pcVar3,lVar6);
            pcVar3 = cave;
            if (_Var4) {
              lVar6 = (loc_conflict)loc(x1 + sVar2,x2 + sVar1);
              square_memorize((chunk *)pcVar3,lVar6);
            }
          }
        }
        _Var4 = square_ismemorybad((chunk *)cave,lVar5);
        if (_Var4) {
          square_forget((chunk *)cave,lVar5);
        }
      }
LAB_0014f26c:
    }
    x2 = x2 + L'\x01';
  } while( true );
}

Assistant:

bool effect_handler_MAP_AREA(effect_handler_context_t *context)
{
	int i, x, y;
	int x1, x2, y1, y2;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	struct loc centre = origin_get_loc(context->origin);

	/* Pick an area to map */
	y1 = centre.y - dist_y;
	y2 = centre.y + dist_y;
	x1 = centre.x - dist_x;
	x2 = centre.x + dist_x;

	/* Drag the co-ordinates into the dungeon */
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Some squares can't be mapped */
			if (square_isno_map(cave, grid)) continue;

			/* All non-walls are "checked" */
			if (!square_seemslikewall(cave, grid)) {
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Memorize normal features */
				if (!square_isfloor(cave, grid))
					square_memorize(cave, grid);

				/* Memorize known walls */
				for (i = 0; i < 8; i++) {
					int yy = y + ddy_ddd[i];
					int xx = x + ddx_ddd[i];

					/* Memorize walls (etc) */
					if (square_seemslikewall(cave, loc(xx, yy)))
						square_memorize(cave, loc(xx, yy));
				}
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (square_ismemorybad(cave, grid)) {
				square_forget(cave, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = y1 - 1; y < y2 + 1; y++) {
		for (x = x1 - 1; x < x2 + 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(cave, grid)) continue;
			square_unmark(cave, grid);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);

	/* Notice */
	context->ident = true;

	return true;
}